

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_seal(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int freeze_flag)

{
  uint8_t *puVar1;
  JSAtom prop;
  JSValue getter;
  JSValue setter;
  int iVar2;
  int iVar3;
  JSObject *p;
  ulong uVar4;
  int64_t iVar5;
  JSValue JVar6;
  uint32_t len;
  JSPropertyEnum *props;
  JSPropertyDescriptor desc;
  uint local_94;
  JSPropertyEnum *local_90;
  undefined4 local_88;
  uint uStack_84;
  undefined8 uStack_80;
  undefined4 local_78;
  uint uStack_74;
  undefined8 uStack_70;
  JSPropertyDescriptor local_68;
  
  p = (JSObject *)(argv->u).ptr;
  iVar5 = argv->tag;
  JVar6 = *argv;
  if ((uint)iVar5 == 0xffffffff) {
    if ((p->field_0).header.dummy2 == 0x29) {
      iVar2 = js_proxy_preventExtensions(ctx,*argv);
      if (-1 < iVar2) {
        if (iVar2 != 0) goto LAB_001302b0;
        JS_ThrowTypeError(ctx,"proxy preventExtensions handler returned false");
      }
    }
    else {
      puVar1 = &(p->field_0).header.dummy1;
      *puVar1 = *puVar1 & 0xfe;
LAB_001302b0:
      iVar2 = JS_GetOwnPropertyNamesInternal(ctx,&local_90,&local_94,p,3);
      if (iVar2 == 0) {
        if ((ulong)local_94 != 0) {
          uVar4 = 0;
          do {
            prop = local_90[uVar4].atom;
            iVar2 = 0x4100;
            if (freeze_flag != 0) {
              iVar3 = JS_GetOwnPropertyInternal(ctx,&local_68,p,prop);
              if (-1 < iVar3) {
                if (iVar3 != 0) {
                  iVar2 = (local_68.flags & 2U | 0x41) << 8;
                  js_free_desc(ctx,&local_68);
                }
                goto LAB_0013035d;
              }
LAB_001303f5:
              js_free_prop_enum(ctx,local_90,local_94);
              goto LAB_001302d1;
            }
LAB_0013035d:
            local_78 = 0;
            uStack_70 = 3;
            local_88 = 0;
            uStack_80 = 3;
            getter.tag = 3;
            getter.u.ptr = (void *)((ulong)uStack_74 << 0x20);
            setter.tag = 3;
            setter.u.ptr = (void *)((ulong)uStack_84 << 0x20);
            iVar2 = JS_DefineProperty(ctx,JVar6,prop,(JSValue)(ZEXT816(3) << 0x40),getter,setter,
                                      iVar2);
            if (iVar2 < 0) goto LAB_001303f5;
            uVar4 = uVar4 + 1;
          } while (local_94 != uVar4);
        }
        js_free_prop_enum(ctx,local_90,local_94);
        goto LAB_001303cc;
      }
    }
LAB_001302d1:
    p = (JSObject *)0x0;
    uVar4 = 0;
    iVar5 = 6;
  }
  else {
    if (0xfffffff4 < (uint)iVar5) {
LAB_001303cc:
      (p->field_0).header.ref_count = (p->field_0).header.ref_count + 1;
    }
    uVar4 = (ulong)p & 0xffffffff00000000;
  }
  JVar6.u.ptr = (void *)((ulong)p & 0xffffffff | uVar4);
  JVar6.tag = iVar5;
  return JVar6;
}

Assistant:

static JSValue js_object_seal(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int freeze_flag)
{
    JSValueConst obj = argv[0];
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;
    int flags, desc_flags, res;

    if (!JS_IsObject(obj))
        return JS_DupValue(ctx, obj);

    res = JS_PreventExtensions(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    if (!res) {
        return JS_ThrowTypeError(ctx, "proxy preventExtensions handler returned false");
    }
    
    p = JS_VALUE_GET_OBJ(obj);
    flags = JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK;
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p, flags))
        return JS_EXCEPTION;

    for(i = 0; i < len; i++) {
        JSPropertyDescriptor desc;
        JSAtom prop = props[i].atom;

        desc_flags = JS_PROP_THROW | JS_PROP_HAS_CONFIGURABLE;
        if (freeze_flag) {
            res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
            if (res < 0)
                goto exception;
            if (res) {
                if (desc.flags & JS_PROP_WRITABLE)
                    desc_flags |= JS_PROP_HAS_WRITABLE;
                js_free_desc(ctx, &desc);
            }
        }
        if (JS_DefineProperty(ctx, obj, prop, JS_UNDEFINED,
                              JS_UNDEFINED, JS_UNDEFINED, desc_flags) < 0)
            goto exception;
    }
    js_free_prop_enum(ctx, props, len);
    return JS_DupValue(ctx, obj);

 exception:
    js_free_prop_enum(ctx, props, len);
    return JS_EXCEPTION;
}